

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O1

void __thiscall QSimplex::dumpMatrix(QSimplex *this)

{
  int iVar1;
  qreal *pqVar2;
  int *piVar3;
  longlong lVar4;
  undefined8 uVar5;
  QArrayData *pQVar6;
  QArrayData *pQVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QArrayData *local_90;
  undefined8 *local_88;
  QArrayData *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 2;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  local_40 = "default";
  QMessageLogger::debug((char *)&local_58,"---- Simplex Matrix ----\n");
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QVar11.m_data = (storage_type *)0x7;
  QVar11.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar11);
  local_78 = (QArrayData *)CONCAT44(uStack_54,local_58);
  puStack_70 = (undefined1 *)CONCAT44(uStack_4c,uStack_50);
  local_68 = (undefined1 *)CONCAT44(uStack_44,uStack_48);
  if (0 < this->columns) {
    lVar10 = 0;
    do {
      QVar12.m_data = (storage_type *)0x7;
      QVar12.m_size = (qsizetype)&local_90;
      QString::fromLatin1(QVar12);
      QString::arg_impl((longlong)&local_58,(int)&local_90,(int)lVar10,(QChar)0x2);
      QString::append((QString *)&local_78);
      piVar3 = (int *)CONCAT44(uStack_54,local_58);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
        }
      }
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,2,0x10);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->columns);
  }
  local_58 = 2;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  local_40 = "default";
  QString::toLocal8Bit_helper((QChar *)&local_90,(longlong)puStack_70);
  puVar8 = local_88;
  if (local_88 == (undefined8 *)0x0) {
    puVar8 = &QByteArray::_empty;
  }
  QMessageLogger::debug((char *)&local_58,"%s",puVar8);
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,1,0x10);
    }
  }
  if (0 < this->rows) {
    lVar10 = 0;
    do {
      QVar13.m_data = (storage_type *)0x7;
      QVar13.m_size = (qsizetype)&local_90;
      QString::fromLatin1(QVar13);
      QString::arg_impl((longlong)&local_58,(int)(QChar *)&local_90,(int)lVar10,(QChar)0x2);
      pQVar6 = local_78;
      pQVar7 = (QArrayData *)CONCAT44(uStack_54,local_58);
      lVar4 = CONCAT44(uStack_4c,uStack_50);
      local_58 = SUB84(local_78,0);
      uStack_54 = (undefined4)((ulong)local_78 >> 0x20);
      uVar5 = CONCAT44(uStack_44,uStack_48);
      uStack_50 = SUB84(puStack_70,0);
      uStack_4c = (undefined4)((ulong)puStack_70 >> 0x20);
      uStack_48 = SUB84(local_68,0);
      uStack_44 = (undefined4)((ulong)local_68 >> 0x20);
      puStack_70 = (undefined1 *)lVar4;
      local_68 = (undefined1 *)uVar5;
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          local_78 = pQVar7;
          QArrayData::deallocate(pQVar6,2,0x10);
          pQVar7 = local_78;
        }
      }
      local_78 = pQVar7;
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,2,0x10);
        }
      }
      iVar1 = this->columns;
      if (0 < iVar1) {
        pqVar2 = this->matrix;
        lVar9 = 0;
        do {
          QVar14.m_data = (storage_type *)0x2;
          QVar14.m_size = (qsizetype)&local_90;
          QString::fromLatin1(QVar14);
          QString::arg_impl(pqVar2[iVar1 * (int)lVar10 + lVar9],(int)&local_58,
                            (char)(QChar *)&local_90,7,(QChar)0x66);
          QString::append((QString *)&local_78);
          piVar3 = (int *)CONCAT44(uStack_54,local_58);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
            }
          }
          if (local_90 != (QArrayData *)0x0) {
            LOCK();
            (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90,2,0x10);
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->columns);
      }
      local_58 = 2;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_40 = "default";
      QString::toLocal8Bit_helper((QChar *)&local_90,(longlong)puStack_70);
      puVar8 = local_88;
      if (local_88 == (undefined8 *)0x0) {
        puVar8 = &QByteArray::_empty;
      }
      QMessageLogger::debug((char *)&local_58,"%s",puVar8);
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,1,0x10);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->rows);
  }
  local_58 = 2;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  local_40 = "default";
  QMessageLogger::debug((char *)&local_58,"------------------------\n");
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSimplex::dumpMatrix()
{
    qDebug("---- Simplex Matrix ----\n");

    QString str("       "_L1);
    for (int j = 0; j < columns; ++j)
        str += QString::fromLatin1("  <%1 >").arg(j, 2);
    qDebug("%s", qPrintable(str));
    for (int i = 0; i < rows; ++i) {
        str = QString::fromLatin1("Row %1:").arg(i, 2);

        qreal *row = matrix + i * columns;
        for (int j = 0; j < columns; ++j)
            str += QString::fromLatin1("%1").arg(row[j], 7, 'f', 2);
        qDebug("%s", qPrintable(str));
    }
    qDebug("------------------------\n");
}